

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecjpake.c
# Opt level: O0

int ecjpake_zkp_write(mbedtls_md_type_t md_type,mbedtls_ecp_group *grp,int pf,mbedtls_ecp_point *G,
                     mbedtls_mpi *x,mbedtls_ecp_point *X,char *id,uchar **p,uchar *end,
                     _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  uchar *puVar1;
  size_t local_98;
  size_t len;
  mbedtls_mpi h;
  mbedtls_mpi v;
  mbedtls_ecp_point V;
  int ret;
  mbedtls_ecp_point *X_local;
  mbedtls_mpi *x_local;
  mbedtls_ecp_point *G_local;
  int pf_local;
  mbedtls_ecp_group *grp_local;
  mbedtls_md_type_t md_type_local;
  
  if (end < *p) {
    grp_local._4_4_ = -0x4f00;
  }
  else {
    mbedtls_ecp_point_init((mbedtls_ecp_point *)&v.s);
    mbedtls_mpi_init((mbedtls_mpi *)&h.s);
    mbedtls_mpi_init((mbedtls_mpi *)&len);
    V.Z._12_4_ = mbedtls_ecp_gen_keypair_base
                           (grp,G,(mbedtls_mpi *)&h.s,(mbedtls_ecp_point *)&v.s,f_rng,p_rng);
    if (((((V.Z._12_4_ == 0) &&
          (V.Z._12_4_ = ecjpake_hash(md_type,grp,pf,G,(mbedtls_ecp_point *)&v.s,X,id,
                                     (mbedtls_mpi *)&len), V.Z._12_4_ == 0)) &&
         (V.Z._12_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&len,(mbedtls_mpi *)&len,x),
         V.Z._12_4_ == 0)) &&
        ((V.Z._12_4_ = mbedtls_mpi_sub_mpi((mbedtls_mpi *)&len,(mbedtls_mpi *)&h.s,
                                           (mbedtls_mpi *)&len), V.Z._12_4_ == 0 &&
         (V.Z._12_4_ = mbedtls_mpi_mod_mpi((mbedtls_mpi *)&len,(mbedtls_mpi *)&len,&grp->N),
         V.Z._12_4_ == 0)))) &&
       (V.Z._12_4_ = mbedtls_ecp_tls_write_point
                               (grp,(mbedtls_ecp_point *)&v.s,pf,&local_98,*p,(long)end - (long)*p),
       V.Z._12_4_ == 0)) {
      *p = *p + local_98;
      local_98 = mbedtls_mpi_size((mbedtls_mpi *)&len);
      if (((end < *p) || ((ulong)((long)end - (long)*p) < local_98 + 1)) || (0xff < local_98)) {
        V.Z._12_4_ = 0xffffb100;
      }
      else {
        puVar1 = *p;
        *p = puVar1 + 1;
        *puVar1 = (uchar)local_98;
        V.Z._12_4_ = mbedtls_mpi_write_binary((mbedtls_mpi *)&len,*p,local_98);
        if (V.Z._12_4_ == 0) {
          *p = *p + local_98;
        }
      }
    }
    mbedtls_ecp_point_free((mbedtls_ecp_point *)&v.s);
    mbedtls_mpi_free((mbedtls_mpi *)&h.s);
    mbedtls_mpi_free((mbedtls_mpi *)&len);
    grp_local._4_4_ = V.Z._12_4_;
  }
  return grp_local._4_4_;
}

Assistant:

static int ecjpake_zkp_write(const mbedtls_md_type_t md_type,
                             const mbedtls_ecp_group *grp,
                             const int pf,
                             const mbedtls_ecp_point *G,
                             const mbedtls_mpi *x,
                             const mbedtls_ecp_point *X,
                             const char *id,
                             unsigned char **p,
                             const unsigned char *end,
                             int (*f_rng)(void *, unsigned char *, size_t),
                             void *p_rng)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_ecp_point V;
    mbedtls_mpi v;
    mbedtls_mpi h; /* later recycled to hold r */
    size_t len;

    if (end < *p) {
        return MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL;
    }

    mbedtls_ecp_point_init(&V);
    mbedtls_mpi_init(&v);
    mbedtls_mpi_init(&h);

    /* Compute signature */
    MBEDTLS_MPI_CHK(mbedtls_ecp_gen_keypair_base((mbedtls_ecp_group *) grp,
                                                 G, &v, &V, f_rng, p_rng));
    MBEDTLS_MPI_CHK(ecjpake_hash(md_type, grp, pf, G, &V, X, id, &h));
    MBEDTLS_MPI_CHK(mbedtls_mpi_mul_mpi(&h, &h, x));     /* x*h */
    MBEDTLS_MPI_CHK(mbedtls_mpi_sub_mpi(&h, &v, &h));     /* v - x*h */
    MBEDTLS_MPI_CHK(mbedtls_mpi_mod_mpi(&h, &h, &grp->N));     /* r */

    /* Write it out */
    MBEDTLS_MPI_CHK(mbedtls_ecp_tls_write_point(grp, &V,
                                                pf, &len, *p, end - *p));
    *p += len;

    len = mbedtls_mpi_size(&h);   /* actually r */
    if (end < *p || (size_t) (end - *p) < 1 + len || len > 255) {
        ret = MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL;
        goto cleanup;
    }

    *(*p)++ = MBEDTLS_BYTE_0(len);
    MBEDTLS_MPI_CHK(mbedtls_mpi_write_binary(&h, *p, len));     /* r */
    *p += len;

cleanup:
    mbedtls_ecp_point_free(&V);
    mbedtls_mpi_free(&v);
    mbedtls_mpi_free(&h);

    return ret;
}